

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_>::Impl<0UL,_false>
::insert(Impl<0UL,_false> *this,
        Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *table,
        size_t pos,StringPtr *row,uint skip)

{
  MaybeUint MVar1;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 in_RAX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RAX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  ulong uVar2;
  Maybe<unsigned_long> MVar3;
  Iterator iter;
  undefined1 local_94 [12];
  Iterator local_88;
  StringPtr *local_70;
  long local_68;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:450:5)>
  local_60;
  
  if (skip == 0) {
    *this = (Impl<0UL,_false>)0x0;
  }
  else {
    local_70 = (table->rows).builder.ptr;
    local_68 = (long)(table->rows).builder.pos - (long)local_70 >> 2;
    local_94._0_4_ = *(undefined4 *)&(row->content).ptr;
    local_60.maybeFunc.ptr.field_1.value.table =
         (Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *)
         local_94;
    local_60.maybeFunc.ptr.field_1.value.indexObj =
         (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)&local_70;
    local_60.maybeFunc.ptr._0_8_ = &PTR_search_00224b90;
    local_94._4_8_ = pos;
    local_60.maybeFunc.ptr.field_1.value.success = (bool *)&table->indexes;
    _::BTreeImpl::insert
              ((Iterator *)((long)local_94 + 0xc),(BTreeImpl *)&(table->indexes).erasedCount,
               (SearchKey *)&local_60);
    in_RAX.value._4_4_ = 0;
    in_RAX.value._0_4_ = local_88.row;
    if (in_RAX.value == 0xe) {
      in_RAX.value = 0xe;
    }
    else {
      MVar1.i = (local_88.leaf)->rows[in_RAX.value].i;
      if ((MVar1.i != 0) &&
         (uVar2 = (ulong)(MVar1.i - 1),
         *(int *)((long)&(local_70->content).ptr + uVar2 * 4) == local_94._0_4_)) {
        *this = (Impl<0UL,_false>)0x1;
        *(ulong *)(this + 8) = uVar2;
        pos = (size_t)in_RAX;
        goto LAB_001620c5;
      }
    }
    memmove((local_88.leaf)->rows + in_RAX.value + 1,(local_88.leaf)->rows + in_RAX.value,
            (ulong)(local_88.row + 1) * -4 + 0x38);
    (local_88.leaf)->rows[in_RAX.value].i = (int)pos + 1;
    local_60.maybeFunc.ptr.isSet = true;
    local_60.maybeFunc.ptr.field_1.value.success = (bool *)((long)local_94 + 0xc);
    local_60.maybeFunc.ptr.field_1.value.pos = (size_t *)(local_94 + 4);
    *this = (Impl<0UL,_false>)0x0;
    local_88.tree._0_1_ = true;
    local_60.maybeFunc.ptr.field_1.value.indexObj = &table->indexes;
    local_60.maybeFunc.ptr.field_1.value.table = table;
    local_60.maybeFunc.ptr.field_1.value.row = row;
    _::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.h:450:5)>
    ::~Deferred(&local_60);
    in_RAX = extraout_RAX;
    pos = (size_t)extraout_RDX;
  }
LAB_001620c5:
  MVar3.ptr.field_1.value = pos;
  MVar3.ptr._0_8_ = in_RAX.value;
  return (Maybe<unsigned_long>)MVar3.ptr;
}

Assistant:

static kj::Maybe<size_t> insert(Table<Row, Indexes...>& table, size_t pos, Row& row, uint skip) {
    if (skip == index) {
      return Impl<index + 1>::insert(table, pos, row, skip);
    }
    auto& indexObj = get<index>(table.indexes);
    KJ_IF_SOME(existing, indexObj.insert(table.rows.asPtr(), pos, indexObj.keyForRow(row))) {
      return existing;
    }

    bool success = false;
    KJ_DEFER(if (!success) {
      indexObj.erase(table.rows.asPtr(), pos, indexObj.keyForRow(row));
    });
    auto result = Impl<index + 1>::insert(table, pos, row, skip);
    success = result == kj::none;
    return result;
  }